

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

bool __thiscall
QDockAreaLayoutInfo::restoreState
          (QDockAreaLayoutInfo *this,QDataStream *stream,QList<QDockWidget_*> *widgets,bool testing)

{
  QList<QDockAreaLayoutItem> *this_00;
  int iVar1;
  QMainWindow *pQVar2;
  QLayoutItem *pQVar3;
  Orientation OVar4;
  char cVar5;
  bool bVar6;
  QDataStream *pQVar7;
  iterator iVar8;
  QDockAreaLayoutItem *pQVar9;
  QWidget *this_01;
  QArrayData *this_02;
  QPlaceHolderItem *this_03;
  quintptr id;
  uint uVar10;
  int iVar11;
  ulong i;
  DockWidgetArea _t1;
  long in_FS_OFFSET;
  QRect rect;
  QStringView QVar12;
  QStringView QVar13;
  int dummy_1;
  int h;
  int w;
  int y;
  int x;
  uchar flags;
  int dummy_3;
  uchar nextMarker;
  int cnt;
  uchar orientation;
  int index;
  uchar marker;
  int dummy;
  QRect local_c0;
  int local_ac;
  int local_a8;
  int local_a4;
  Representation local_a0;
  byte local_99;
  QArrayData *local_98;
  storage_type_conflict *psStack_90;
  QPlaceHolderItem *local_88;
  char local_79;
  int local_78;
  byte local_71;
  uint local_70;
  char local_69;
  QDockAreaLayoutItem local_68;
  long local_38;
  undefined4 extraout_var;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_69 = -0x56;
  QDataStream::operator>>(stream,&local_69);
  if ((local_69 == -4) || (local_69 == -6)) {
    this->tabbed = local_69 == -6;
    local_70 = 0xffffffff;
    if (local_69 == -6) {
      QDataStream::operator>>(stream,(int *)&local_70);
    }
    local_71 = 0xaa;
    QDataStream::operator>>(stream,&local_71);
    this->o = (uint)local_71;
    local_78 = -0x55555556;
    QDataStream::operator>>(stream,&local_78);
    if (0 < local_78) {
      this_00 = &this->item_list;
      iVar11 = 0;
      do {
        local_79 = -0x56;
        QDataStream::operator>>(stream,&local_79);
        if (local_79 == -4) {
          local_98 = (QArrayData *)CONCAT44(local_98._4_4_,0xaaaaaaaa);
          local_68.flags = 0xaaaaaaaa;
          local_68._36_4_ = 0xaaaaaaaa;
          local_68.subinfo = (QDockAreaLayoutInfo *)operator_new(0x70);
          iVar1 = this->tabBarShape;
          pQVar2 = this->mainWindow;
          (local_68.subinfo)->sep = this->sep;
          ((local_68.subinfo)->separatorWidgets).d.size = 0;
          ((local_68.subinfo)->separatorWidgets).d.d = (Data *)0x0;
          ((local_68.subinfo)->separatorWidgets).d.ptr = (QWidget **)0x0;
          OVar4 = this->o;
          (local_68.subinfo)->dockPos = this->dockPos;
          (local_68.subinfo)->o = OVar4;
          ((local_68.subinfo)->rect).x1 = 0;
          ((local_68.subinfo)->rect).y1 = 0;
          ((local_68.subinfo)->rect).x2 = -1;
          ((local_68.subinfo)->rect).y2 = -1;
          (local_68.subinfo)->mainWindow = pQVar2;
          (local_68.subinfo)->tabBar = (QTabBar *)0x0;
          *(undefined8 *)((long)&((local_68.subinfo)->item_list).d.ptr + 1) = 0;
          *(undefined8 *)((long)&((local_68.subinfo)->item_list).d.size + 1) = 0;
          ((local_68.subinfo)->item_list).d.d = (Data *)0x0;
          ((local_68.subinfo)->item_list).d.ptr = (QDockAreaLayoutItem *)0x0;
          (local_68.subinfo)->tabBarShape = iVar1;
          local_68.widgetItem = (QLayoutItem *)0x0;
          local_68.placeHolderItem = (QPlaceHolderItem *)0x0;
          local_68.pos = 0;
          local_68.size = -1;
          local_68.flags = 0;
          pQVar7 = (QDataStream *)QDataStream::operator>>(stream,&local_68.pos);
          pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,&local_68.size);
          pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,(int *)&local_98);
          QDataStream::operator>>(pQVar7,(int *)&local_98);
          pQVar9 = &local_68;
          if (!testing) {
            QtPrivate::QGenericArrayOps<QDockAreaLayoutItem>::emplace<QDockAreaLayoutItem_const&>
                      ((QGenericArrayOps<QDockAreaLayoutItem> *)this_00,(this->item_list).d.size,
                       &local_68);
            QList<QDockAreaLayoutItem>::end(this_00);
            iVar8 = QList<QDockAreaLayoutItem>::end(this_00);
            pQVar9 = iVar8.i + -1;
          }
          bVar6 = restoreState(pQVar9->subinfo,stream,widgets,testing);
          QDockAreaLayoutItem::~QDockAreaLayoutItem(&local_68);
          if (!bVar6) goto LAB_003f461d;
        }
        else {
          if (local_79 != -5) goto LAB_003f461d;
          local_98 = (QArrayData *)0x0;
          psStack_90 = (storage_type_conflict *)0x0;
          local_88 = (QPlaceHolderItem *)0x0;
          local_99 = 0xaa;
          pQVar7 = (QDataStream *)::operator>>(stream,(QString *)&local_98);
          QDataStream::operator>>(pQVar7,&local_99);
          if (local_88 == (QPlaceHolderItem *)0x0) {
            local_68.widgetItem = (QLayoutItem *)CONCAT44(local_68.widgetItem._4_4_,0xaaaaaaaa);
            pQVar7 = (QDataStream *)QDataStream::operator>>(stream,(int *)&local_68);
            pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,(int *)&local_68);
            pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,(int *)&local_68);
            QDataStream::operator>>(pQVar7,(int *)&local_68);
          }
          else {
            if ((widgets->d).size != 0) {
              i = 0;
              do {
                QObject::objectName();
                if (local_68.placeHolderItem == local_88) {
                  QVar12.m_data = (storage_type_conflict *)local_68.subinfo;
                  QVar12.m_size = (qsizetype)local_68.placeHolderItem;
                  QVar13.m_data = psStack_90;
                  QVar13.m_size = (qsizetype)local_68.placeHolderItem;
                  cVar5 = QtPrivate::equalStrings(QVar12,QVar13);
                }
                else {
                  cVar5 = '\0';
                }
                if ((QArrayData *)local_68.widgetItem != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)&(local_68.widgetItem)->_vptr_QLayoutItem)->_q_value).
                  super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)&(local_68.widgetItem)->_vptr_QLayoutItem)->_q_value).
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)&(local_68.widgetItem)->_vptr_QLayoutItem)->_q_value).
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate((QArrayData *)local_68.widgetItem,2,0x10);
                  }
                }
                if (cVar5 != '\0') {
                  this_01 = &QList<QDockWidget_*>::takeAt(widgets,i)->super_QWidget;
                  if (this_01 != (QWidget *)0x0) {
                    local_68.flags = 0xaaaaaaaa;
                    local_68._36_4_ = 0xaaaaaaaa;
                    local_68.placeHolderItem = (QPlaceHolderItem *)&DAT_aaaaaaaaaaaaaaaa;
                    local_68.pos = -0x55555556;
                    local_68.size = -0x55555556;
                    local_68.widgetItem = (QLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
                    local_68.subinfo = (QDockAreaLayoutInfo *)&DAT_aaaaaaaaaaaaaaaa;
                    this_02 = (QArrayData *)operator_new(0x18);
                    QDockWidgetItem::QDockWidgetItem
                              ((QDockWidgetItem *)this_02,(QDockWidget *)this_01);
                    local_68.subinfo = (QDockAreaLayoutInfo *)0x0;
                    local_68.placeHolderItem = (QPlaceHolderItem *)0x0;
                    local_68.pos = 0;
                    local_68.size = -1;
                    local_68.flags = 0;
                    local_68.widgetItem = (QLayoutItem *)this_02;
                    if ((local_99 & 2) == 0) {
                      local_c0.x1.m_i = -0x55555556;
                      pQVar7 = (QDataStream *)QDataStream::operator>>(stream,&local_68.pos);
                      pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,&local_68.size);
                      pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,(int *)&local_c0);
                      QDataStream::operator>>(pQVar7,(int *)&local_c0);
                      if (!testing) {
                        QtPrivate::QGenericArrayOps<QDockAreaLayoutItem>::
                        emplace<QDockAreaLayoutItem_const&>
                                  ((QGenericArrayOps<QDockAreaLayoutItem> *)this_00,
                                   (this->item_list).d.size,&local_68);
                        QList<QDockAreaLayoutItem>::end(this_00);
                        _t1 = NoDockWidgetArea;
                        QDockWidget::setFloating((QDockWidget *)this_01,false);
                        (**(code **)(*(long *)this_01 + 0x68))(this_01,local_99 & 1);
                        if ((ulong)this->dockPos < 4) {
                          _t1 = *(DockWidgetArea *)(&DAT_006d4f10 + (ulong)this->dockPos * 4);
                        }
                        QDockWidget::dockLocationChanged((QDockWidget *)this_01,_t1);
                      }
                    }
                    else {
                      if (!testing) {
                        QWidget::hide(this_01);
                        QDockWidget::setFloating((QDockWidget *)this_01,true);
                      }
                      local_a0.m_i = -0x55555556;
                      local_a4 = -0x55555556;
                      local_a8 = -0x55555556;
                      local_ac = -0x55555556;
                      pQVar7 = (QDataStream *)QDataStream::operator>>(stream,&local_a0.m_i);
                      pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,&local_a4);
                      pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,&local_a8);
                      QDataStream::operator>>(pQVar7,&local_ac);
                      if (!testing) {
                        rect.x1.m_i = local_a0.m_i + local_a8 + -1;
                        uVar10 = (local_a4 + local_ac) - 1;
                        rect.y1.m_i = uVar10;
                        rect._8_8_ = this_01;
                        local_c0 = QDockAreaLayout::constrainedRect
                                             ((QDockAreaLayout *)CONCAT44(local_a4,local_a0.m_i),
                                              rect,(QWidget *)((ulong)uVar10 << 0x20));
                        QWidget::setGeometry(this_01,&local_c0);
                        (**(code **)(*(long *)this_01 + 0x68))(this_01,local_99 & 1);
                        QtPrivate::QGenericArrayOps<QDockAreaLayoutItem>::
                        emplace<QDockAreaLayoutItem_const&>
                                  ((QGenericArrayOps<QDockAreaLayoutItem> *)this_00,
                                   (this->item_list).d.size,&local_68);
                        QList<QDockAreaLayoutItem>::end(this_00);
                      }
                    }
                    if (testing) {
                      if ((QArrayData *)local_68.widgetItem != (QArrayData *)0x0) {
                        (**(code **)(*(long *)local_68.widgetItem + 8))();
                      }
                      local_68.widgetItem = (QLayoutItem *)0x0;
                    }
                    goto LAB_003f44bf;
                  }
                  break;
                }
                i = i + 1;
              } while (i < (ulong)(widgets->d).size);
            }
            this_03 = (QPlaceHolderItem *)operator_new(0x30);
            (this_03->objectName).d.d = (Data *)0x0;
            (this_03->objectName).d.ptr = (char16_t *)0x0;
            *(undefined8 *)((long)&(this_03->objectName).d.ptr + 2) = 0;
            *(undefined8 *)((long)&(this_03->objectName).d.size + 2) = 0;
            (this_03->topLevelRect).x1 = 0;
            (this_03->topLevelRect).y1 = 0;
            (this_03->topLevelRect).x2 = -1;
            (this_03->topLevelRect).y2 = -1;
            local_68._36_4_ = 0xaaaaaaaa;
            local_68.widgetItem = (QLayoutItem *)0x0;
            local_68.subinfo = (QDockAreaLayoutInfo *)0x0;
            local_68.pos = 0;
            local_68.size = -1;
            local_68.flags = 0;
            local_68.placeHolderItem = this_03;
            QString::operator=((QString *)this_03,(QString *)&local_98);
            bVar6 = (bool)(local_99 >> 1 & 1);
            this_03->window = bVar6;
            this_03->hidden = (bool)(~local_99 & 1);
            if (bVar6 == false) {
              local_c0.x1.m_i = -0x55555556;
              pQVar7 = (QDataStream *)QDataStream::operator>>(stream,&local_68.pos);
              pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,&local_68.size);
              pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,(int *)&local_c0);
              QDataStream::operator>>(pQVar7,(int *)&local_c0);
            }
            else {
              local_c0.x1.m_i = -0x55555556;
              local_a0.m_i = -0x55555556;
              local_a4 = -0x55555556;
              local_a8 = -0x55555556;
              pQVar7 = (QDataStream *)QDataStream::operator>>(stream,(int *)&local_c0);
              pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,&local_a0.m_i);
              pQVar7 = (QDataStream *)QDataStream::operator>>(pQVar7,&local_a4);
              QDataStream::operator>>(pQVar7,&local_a8);
              (this_03->topLevelRect).x1.m_i = local_c0.x1.m_i;
              (this_03->topLevelRect).y1.m_i = local_a0.m_i;
              (this_03->topLevelRect).x2.m_i = local_c0.x1.m_i + -1 + local_a4;
              (this_03->topLevelRect).y2.m_i = local_a0.m_i + -1 + local_a8;
            }
            if (local_68.size != -1) {
              local_68.flags = local_68.flags | 2;
            }
            if (!testing) {
              QtPrivate::QGenericArrayOps<QDockAreaLayoutItem>::emplace<QDockAreaLayoutItem_const&>
                        ((QGenericArrayOps<QDockAreaLayoutItem> *)this_00,(this->item_list).d.size,
                         &local_68);
              QList<QDockAreaLayoutItem>::end(this_00);
            }
LAB_003f44bf:
            QDockAreaLayoutItem::~QDockAreaLayoutItem(&local_68);
          }
          if (local_98 != (QArrayData *)0x0) {
            LOCK();
            (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_98,2,0x10);
            }
          }
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 < local_78);
    }
    bVar6 = true;
    if (!testing) {
      if (((-1 < (int)local_70 & this->tabbed) == 1) &&
         ((ulong)local_70 < (ulong)(this->item_list).d.size)) {
        updateTabBar(this);
        pQVar3 = (this->item_list).d.ptr[(int)local_70].widgetItem;
        if (pQVar3 == (QLayoutItem *)0x0) {
          id = 0;
        }
        else {
          iVar11 = (*pQVar3->_vptr_QLayoutItem[0xd])();
          id = CONCAT44(extraout_var,iVar11);
        }
        setCurrentTabId(this,id);
      }
      if (*this->sep == 1) {
        updateSeparatorWidgets(this);
      }
    }
  }
  else {
LAB_003f461d:
    bVar6 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool QDockAreaLayoutInfo::restoreState(QDataStream &stream, QList<QDockWidget*> &widgets, bool testing)
{
    uchar marker;
    stream >> marker;
    if (marker != TabMarker && marker != SequenceMarker)
        return false;

#if QT_CONFIG(tabbar)
    tabbed = marker == TabMarker;

    int index = -1;
    if (tabbed)
        stream >> index;
#endif

    uchar orientation;
    stream >> orientation;
    o = static_cast<Qt::Orientation>(orientation);

    int cnt;
    stream >> cnt;

    for (int i = 0; i < cnt; ++i) {
        uchar nextMarker;
        stream >> nextMarker;
        if (nextMarker == WidgetMarker) {
            QString name;
            uchar flags;
            stream >> name >> flags;
            if (name.isEmpty()) {
                int dummy;
                stream >> dummy >> dummy >> dummy >> dummy;
                continue;
            }

            QDockWidget *widget = nullptr;
            for (int j = 0; j < widgets.size(); ++j) {
                if (widgets.at(j)->objectName() == name) {
                    widget = widgets.takeAt(j);
                    break;
                }
            }

            if (widget == nullptr) {
                QPlaceHolderItem *placeHolder = new QPlaceHolderItem;
                QDockAreaLayoutItem item(placeHolder);

                placeHolder->objectName = name;
                placeHolder->window = flags & StateFlagFloating;
                placeHolder->hidden = !(flags & StateFlagVisible);
                if (placeHolder->window) {
                    int x, y, w, h;
                    stream >> x >> y >> w >> h;
                    placeHolder->topLevelRect = QRect(x, y, w, h);
                } else {
                    int dummy;
                    stream >> item.pos >> item.size >> dummy >> dummy;
                }
                if (item.size != -1)
                    item.flags |= QDockAreaLayoutItem::KeepSize;
                if (!testing)
                    item_list.append(item);
            } else {
                QDockAreaLayoutItem item(new QDockWidgetItem(widget));
                if (flags & StateFlagFloating) {
                    bool drawer = false;

                    if (!testing) {
                        widget->hide();
                        if (!drawer)
                            widget->setFloating(true);
                    }

                    int x, y, w, h;
                    stream >> x >> y >> w >> h;

                    if (!testing)
                        widget->setGeometry(QDockAreaLayout::constrainedRect(QRect(x, y, w, h), widget));

                    if (!testing) {
                        widget->setVisible(flags & StateFlagVisible);
                        item_list.append(item);
                    }
                } else {
                    int dummy;
                    stream >> item.pos >> item.size >> dummy >> dummy;
                    if (!testing) {
                        item_list.append(item);
                        widget->setFloating(false);
                        widget->setVisible(flags & StateFlagVisible);
                        emit widget->dockLocationChanged(toDockWidgetArea(dockPos));
                    }
                }
                if (testing) {
                    //was it is not really added to the layout, we need to delete the object here
                    delete item.widgetItem;
                    item.widgetItem = nullptr;
                }
            }
        } else if (nextMarker == SequenceMarker) {
            int dummy;
#if !QT_CONFIG(tabbar)
            const int tabBarShape = 0;
#endif
            QDockAreaLayoutItem item(new QDockAreaLayoutInfo(sep, dockPos, o,
                                                                tabBarShape, mainWindow));
            stream >> item.pos >> item.size >> dummy >> dummy;
            //we need to make sure the element is in the list so the dock widget can eventually be docked correctly
            if (!testing)
                item_list.append(item);

            //here we need to make sure we change the item in the item_list
            QDockAreaLayoutItem &lastItem = testing ? item : item_list.last();

            if (!lastItem.subinfo->restoreState(stream, widgets, testing))
                return false;

        } else {
            return false;
        }
    }

#if QT_CONFIG(tabbar)
    if (!testing && tabbed && index >= 0 && index < item_list.size()) {
        updateTabBar();
        setCurrentTabId(tabId(item_list.at(index)));
    }
    if (!testing && *sep == 1)
        updateSeparatorWidgets();
#endif

    return true;
}